

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O2

libdeflate_decompressor * libdeflate_alloc_decompressor_ex(libdeflate_options *options)

{
  malloc_func_t p_Var1;
  libdeflate_decompressor *__s;
  free_func_t p_Var2;
  
  if (options->sizeof_options == 0x18) {
    p_Var1 = options->malloc_func;
    if (options->malloc_func == (malloc_func_t)0x0) {
      p_Var1 = libdeflate_default_malloc_func;
    }
    __s = (libdeflate_decompressor *)(*p_Var1)(0x2d30);
    if (__s != (libdeflate_decompressor *)0x0) {
      memset(__s,0,0x2d30);
      p_Var2 = options->free_func;
      if (options->free_func == (free_func_t)0x0) {
        p_Var2 = libdeflate_default_free_func;
      }
      __s->free_func = p_Var2;
      return __s;
    }
  }
  return (libdeflate_decompressor *)0x0;
}

Assistant:

libdeflate_decompressor *
libdeflate_alloc_decompressor_ex(const struct libdeflate_options *options)
{
	struct libdeflate_decompressor *d;

	/*
	 * Note: if more fields are added to libdeflate_options, this code will
	 * need to be updated to support both the old and new structs.
	 */
	if (options->sizeof_options != sizeof(*options))
		return NULL;

	d = (options->malloc_func ? options->malloc_func :
	     libdeflate_default_malloc_func)(sizeof(*d));
	if (d == NULL)
		return NULL;
	/*
	 * Note that only certain parts of the decompressor actually must be
	 * initialized here:
	 *
	 * - 'static_codes_loaded' must be initialized to false.
	 *
	 * - The first half of the main portion of each decode table must be
	 *   initialized to any value, to avoid reading from uninitialized
	 *   memory during table expansion in build_decode_table().  (Although,
	 *   this is really just to avoid warnings with dynamic tools like
	 *   valgrind, since build_decode_table() is guaranteed to initialize
	 *   all entries eventually anyway.)
	 *
	 * - 'free_func' must be set.
	 *
	 * But for simplicity, we currently just zero the whole decompressor.
	 */
	memset(d, 0, sizeof(*d));
	d->free_func = options->free_func ?
		       options->free_func : libdeflate_default_free_func;
	return d;
}